

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Entry * __thiscall
kj::
Table<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry,_kj::HashIndex<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Callbacks>_>
::insert(Table<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry,_kj::HashIndex<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Callbacks>_>
         *this,Entry *row)

{
  Entry *pEVar1;
  RemoveConst<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry> *pRVar2;
  size_t sVar3;
  long lVar4;
  RemoveConst<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry> *pRVar5;
  byte bVar6;
  ArrayPtr<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry> table;
  HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks> local_28 [16];
  
  bVar6 = 0;
  pEVar1 = (this->rows).builder.ptr;
  sVar3 = ((long)(this->rows).builder.pos - (long)pEVar1 >> 4) * -0x3333333333333333;
  table.size_ = (size_t)pEVar1;
  table.ptr = (Entry *)&this->indexes;
  HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks>::
  insert<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Entry,kj::StringPtr&>
            (local_28,table,sVar3,(StringPtr *)sVar3);
  if (local_28[0] !=
      (HashIndex<kj::HashMap<kj::StringPtr,capnp::StructSchema::Field>::Callbacks>)0x1) {
    pRVar5 = (this->rows).builder.pos;
    if (pRVar5 == (this->rows).builder.endPtr) {
      pRVar2 = (this->rows).builder.ptr;
      sVar3 = 4;
      if (pRVar5 != pRVar2) {
        sVar3 = ((long)pRVar5 - (long)pRVar2 >> 4) * -0x6666666666666666;
      }
      Vector<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry>::setCapacity
                (&this->rows,sVar3);
      pRVar5 = (this->rows).builder.pos;
    }
    for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pRVar5->key).content.ptr = (row->key).content.ptr;
      row = (Entry *)((long)row + (ulong)bVar6 * -0x10 + 8);
      pRVar5 = (RemoveConst<kj::HashMap<kj::StringPtr,_capnp::StructSchema::Field>::Entry> *)
               ((long)pRVar5 + (ulong)bVar6 * -0x10 + 8);
    }
    pEVar1 = (this->rows).builder.pos;
    (this->rows).builder.pos = pEVar1 + 1;
    return pEVar1;
  }
  kj::_::throwDuplicateTableRow();
}

Assistant:

Row& Table<Row, Indexes...>::insert(Row&& row) {
  KJ_IF_MAYBE(existing, Impl<>::insert(*this, rows.size(), row, kj::maxValue)) {
    _::throwDuplicateTableRow();
  } else {
    return rows.add(kj::mv(row));
  }